

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O0

void __thiscall fe::PixelDISTANCE::getPixel(PixelDISTANCE *this,uchar *data,Pixel *p,int x,int y)

{
  float fVar1;
  float fVar2;
  uchar uVar3;
  int local_38;
  int color;
  int f;
  int t;
  float d2;
  float d1;
  int y_local;
  int x_local;
  Pixel *p_local;
  uchar *data_local;
  PixelDISTANCE *this_local;
  
  fVar1 = *(float *)data;
  fVar2 = *(float *)(data + 4);
  local_38 = (int)((fVar1 - fVar2) * 10.0);
  if (local_38 < 0) {
    local_38 = -local_38;
  }
  if (0xff < local_38) {
    local_38 = 0xff;
  }
  uVar3 = 0xff - (char)local_38;
  if (0.0 < fVar1) {
    (p->field_0).field_0.bytes[0] = uVar3;
    (p->field_0).field_0.bytes[1] = '\0';
    (p->field_0).field_0.bytes[2] = '\0';
  }
  if (fVar1 < 0.0) {
    (p->field_0).field_0.bytes[0] = '\0';
    (p->field_0).field_0.bytes[1] = uVar3;
    (p->field_0).field_0.bytes[2] = '\0';
  }
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    uVar3 = (uchar)(int)(-fVar2 * 255.0 + 255.0);
    (p->field_0).field_0.bytes[0] = uVar3;
    (p->field_0).field_0.bytes[1] = uVar3;
    (p->field_0).field_0.bytes[2] = uVar3;
  }
  (p->field_0).field_0.bytes[3] = 0xff;
  return;
}

Assistant:

void getPixel(GET_PIXEL_ARGS) const
        {
            float d1 = *(float*)data;
            float d2 = *((float*)data + 1);
            int t = int((d1 - d2) * 10);
            int f = t;
            if (f < 0)
                f = -f;
            if (f > 255)
                f = 255;
            int color = 255 - f;

            if (d1 > 0)
            {
                p.r = color;
                p.g = 0;
                p.b = 0;
            }
            if (d1 < 0)
            {
                p.r = 0;
                p.g = color;
                p.b = 0;
            }

            if (d1 == 0)
            {
                color = int(255 - d2 * 255);
                p.r = color;
                p.g = color;
                p.b = color;
            }
            p.a = 255;
        }